

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O0

void knote_release(knote *kn)

{
  int *piVar1;
  int iVar2;
  void *in_RDI;
  
  LOCK();
  piVar1 = (int *)((long)in_RDI + 0x30);
  iVar2 = *piVar1;
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if ((iVar2 == 1) && ((*(uint *)((long)in_RDI + 0x20) & 0x80000000) != 0)) {
    free(in_RDI);
  }
  return;
}

Assistant:

void
knote_release(struct knote *kn)
{
    assert (kn->kn_ref > 0);

    if (atomic_dec(&kn->kn_ref) == 0) {
        if (kn->kn_flags & KNFL_KNOTE_DELETED) {
            dbg_printf("kn=%p - freeing", kn);
#ifndef NDEBUG
            memset(kn, 0x42, sizeof(*kn));
#endif
            free(kn);
        } else {
            dbg_puts("kn=%p - attempted to free knote without marking it as deleted");
        }
    } else {
        dbg_printf("kn=%p rc=%d - decrementing refcount", kn, kn->kn_ref);
    }
}